

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

int Curl_hash_delete(Curl_hash *h,void *key,size_t key_len)

{
  Curl_hash_element **ppCVar1;
  Curl_hash_element *he_00;
  size_t sVar2;
  Curl_hash_element *local_38;
  Curl_hash_element **he_anchor;
  Curl_hash_element *he;
  size_t key_len_local;
  void *key_local;
  Curl_hash *h_local;
  
  if (h->table == (Curl_hash_element **)0x0) {
LAB_00148793:
    h_local._4_4_ = 1;
  }
  else {
    ppCVar1 = h->table;
    sVar2 = (*h->hash_func)(key,key_len,h->slots);
    he_00 = (Curl_hash_element *)(ppCVar1 + sVar2);
    do {
      local_38 = he_00;
      if (local_38->next == (Curl_hash_element *)0x0) goto LAB_00148793;
      he_00 = local_38->next;
      sVar2 = (*h->comp_func)(he_00->key,he_00->key_len,key,key_len);
    } while (sVar2 == 0);
    hash_elem_unlink(h,&local_38->next,he_00);
    hash_elem_destroy(h,he_00);
    h_local._4_4_ = 0;
  }
  return h_local._4_4_;
}

Assistant:

int Curl_hash_delete(struct Curl_hash *h, void *key, size_t key_len)
{
  DEBUGASSERT(h);
  DEBUGASSERT(h->slots);
  DEBUGASSERT(h->init == HASHINIT);
  if(h->table) {
    struct Curl_hash_element *he, **he_anchor;

    he_anchor = CURL_HASH_SLOT_ADDR(h, key, key_len);
    while(*he_anchor) {
      he = *he_anchor;
      if(h->comp_func(he->key, he->key_len, key, key_len)) {
        hash_elem_unlink(h, he_anchor, he);
        hash_elem_destroy(h, he);
        return 0;
      }
      he_anchor = &he->next;
    }
  }
  return 1;
}